

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_dirt.cc
# Opt level: O2

void __thiscall FilesystemDirt::AddDirtyPath(FilesystemDirt *this,string *path)

{
  ulong uVar1;
  long lVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_bool>
  pVar3;
  string remainder;
  string first;
  FilesystemDirt local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
  local_80;
  
  if (this->dirty_ == false) {
    if (path->_M_string_length == 0) {
      this->dirty_ = true;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
      ::clear(&(this->children_)._M_t);
      return;
    }
    uVar1 = std::__cxx11::string::find_first_not_of((char)path,0x2f);
    lVar2 = std::__cxx11::string::find((char)path,0x2f);
    std::__cxx11::string::string((string *)&first,(string *)path,uVar1,lVar2 - uVar1);
    remainder._M_dataplus._M_p = (pointer)&remainder.field_2;
    remainder._M_string_length = 0;
    remainder.field_2._M_local_buf[0] = '\0';
    if (lVar2 != -1) {
      std::__cxx11::string::string
                ((string *)&local_80,(string *)path,lVar2 + 1,(allocator *)&local_b8);
      std::__cxx11::string::operator=((string *)&remainder,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8.dirty_ = false;
    local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b8.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FilesystemDirt,_true>
              (&local_80,&first,&local_b8);
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,FilesystemDirt>,std::_Select1st<std::pair<std::__cxx11::string_const,FilesystemDirt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,FilesystemDirt>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,FilesystemDirt>,std::_Select1st<std::pair<std::__cxx11::string_const,FilesystemDirt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
                        *)&this->children_,&local_80);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
    ::~pair(&local_80);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
    ::~_Rb_tree(&local_b8.children_._M_t);
    AddDirtyPath((FilesystemDirt *)(pVar3.first._M_node._M_node + 2),&remainder);
    std::__cxx11::string::~string((string *)&remainder);
    std::__cxx11::string::~string((string *)&first);
  }
  return;
}

Assistant:

void FilesystemDirt::AddDirtyPath(const std::string& path) {
  if (!dirty_) {
    if (path.empty()) {
      // No further pathname components. Mark this file dirty.
      dirty_ = true;
      children_.clear();
    } else {
      // Extract first pathname component from input path.
      std::size_t nonslash = path.find_first_not_of('/');
      std::size_t slash = path.find('/', nonslash);
      std::string first(path, nonslash, slash - nonslash);
      std::string remainder;
      if (slash != std::string::npos)
        remainder = std::string(path, slash + 1);

      // Continue to next pathname component.
      auto child = children_.insert({first, FilesystemDirt()});
      child.first->second.AddDirtyPath(remainder);
    }
  }
}